

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void __thiscall PFloat::SetOps(PFloat *this)

{
  PFloat *this_local;
  
  if (*(int *)&(this->super_PBasicType).super_PType.super_PTypeBase.super_DObject.field_0x24 == 4) {
    (this->super_PBasicType).super_PType.storeOp = '+';
    (this->super_PBasicType).super_PType.loadOp = '\x16';
  }
  else {
    if (*(int *)&(this->super_PBasicType).super_PType.super_PTypeBase.super_DObject.field_0x24 != 8)
    {
      __assert_fail("Size == 8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobjtype.cpp"
                    ,0x4d3,"void PFloat::SetOps()");
    }
    (this->super_PBasicType).super_PType.storeOp = '-';
    (this->super_PBasicType).super_PType.loadOp = '\x18';
  }
  (this->super_PBasicType).super_PType.moveOp = '9';
  (this->super_PBasicType).super_PType.RegType = '\x01';
  return;
}

Assistant:

void PFloat::SetOps()
{
	if (Size == 4)
	{
		storeOp = OP_SSP;
		loadOp = OP_LSP;
	}
	else
	{
		assert(Size == 8);
		storeOp = OP_SDP;
		loadOp = OP_LDP;
	}
	moveOp = OP_MOVEF;
	RegType = REGT_FLOAT;
}